

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_buffer
          (xml_buffered_writer *this,char_t *data,size_t length)

{
  ulong uVar1;
  
  uVar1 = this->bufsize + length;
  if (uVar1 < 0x801) {
    memcpy(this->buffer + this->bufsize,data,length);
    this->bufsize = uVar1;
    return;
  }
  write_direct(this,data,length);
  return;
}

Assistant:

void write_buffer(const char_t* data, size_t length)
		{
			size_t offset = bufsize;

			if (offset + length <= bufcapacity)
			{
				memcpy(buffer + offset, data, length * sizeof(char_t));
				bufsize = offset + length;
			}
			else
			{
				write_direct(data, length);
			}
		}